

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::AppendTlv(Error *__return_storage_ptr__,Message *aMessage,Tlv *aTlv)

{
  char cVar1;
  bool bVar2;
  Type TVar3;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  ByteArray buf;
  writer write;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = tlv::Tlv::IsValid(aTlv);
  if (bVar2) {
    tlv::Tlv::Serialize(aTlv,&buf);
    coap::Message::Append(aMessage,&buf);
  }
  else {
    local_68.types_[0] = uint_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the tlv(type={}) is in bad format";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x21;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
    from = "the tlv(type={}) is in bad format";
    write.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
          ::writer::operator()(&write,from,"");
          goto LAB_0016fee7;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
      ::writer::operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                       (to,"",&local_68);
    }
LAB_0016fee7:
    TVar3 = tlv::Tlv::GetType(aTlv);
    local_68._0_8_ = ZEXT18(TVar3);
    fmt.size_ = 2;
    fmt.data_ = (char *)0x21;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"the tlv(type={}) is in bad format",fmt,args);
    local_90._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error AppendTlv(coap::Message &aMessage, const tlv::Tlv &aTlv)
{
    Error     error;
    ByteArray buf;

    VerifyOrExit(aTlv.IsValid(),
                 error = ERROR_INVALID_ARGS("the tlv(type={}) is in bad format", utils::to_underlying(aTlv.GetType())));

    aTlv.Serialize(buf);
    aMessage.Append(buf);

exit:
    return error;
}